

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pcache1RemoveFromHash(PgHdr1 *pPage,int freeFlag)

{
  long lVar1;
  PgHdr1 *p;
  int in_ESI;
  void *in_RDI;
  PgHdr1 **pp;
  PCache1 *pCache;
  uint h;
  
  lVar1 = *(long *)((long)in_RDI + 0x20);
  for (p = (PgHdr1 *)
           (*(long *)(lVar1 + 0x40) +
           (ulong)(*(uint *)((long)in_RDI + 0x10) % *(uint *)(lVar1 + 0x3c)) * 8);
      (p->page).pBuf != in_RDI; p = (PgHdr1 *)((long)(p->page).pBuf + 0x18)) {
  }
  (p->page).pBuf = *(void **)((long)(p->page).pBuf + 0x18);
  *(int *)(lVar1 + 0x38) = *(int *)(lVar1 + 0x38) + -1;
  if (in_ESI != 0) {
    pcache1FreePage(p);
  }
  return;
}

Assistant:

static void pcache1RemoveFromHash(PgHdr1 *pPage, int freeFlag){
  unsigned int h;
  PCache1 *pCache = pPage->pCache;
  PgHdr1 **pp;

  assert( sqlite3_mutex_held(pCache->pGroup->mutex) );
  h = pPage->iKey % pCache->nHash;
  for(pp=&pCache->apHash[h]; (*pp)!=pPage; pp=&(*pp)->pNext);
  *pp = (*pp)->pNext;

  pCache->nPage--;
  if( freeFlag ) pcache1FreePage(pPage);
}